

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerThreadPool.cpp
# Opt level: O0

bool __thiscall
PyreNet::LayerThreadPool::waitForTasks::anon_class_8_1_a8b1e06b::operator()
          (anon_class_8_1_a8b1e06b *this)

{
  anon_class_8_1_a8b1e06b *this_local;
  
  return *this->track < 1;
}

Assistant:

[[noreturn]] void LayerThreadPool::threadJob() {
        LayerThreadPool* tpi = getInstance();
        std::unique_lock<std::mutex> lg(tpi->queueMutex);
        while (true) {
            if (!tpi->layerQueue.empty()) {
                LayerQueueJob job = tpi->layerQueue.front();
                tpi->layerQueue.pop();
                lg.unlock();
                job.p.calculate(job.input, job.activation);
                std::lock_guard<std::mutex> lgt(tpi->trackMutex);
                job.track--;
                if (job.track == 0) {
                    tpi->jobDoneCv.notify_all();
                }
                lg.lock();
            } else {
                tpi->newJobCv.wait(lg);
            }
        }
    }